

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_automaticIdsOnEverything_Test::TestBody(Annotator_automaticIdsOnEverything_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  element_type *peVar5;
  AssertHelper local_d80 [8];
  Message local_d78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d70;
  undefined1 local_d50 [8];
  AssertionResult gtest_ar_25;
  Message local_d38 [15];
  allocator<char> local_d29;
  string local_d28 [32];
  shared_ptr<libcellml::Component> local_d08;
  shared_ptr<libcellml::Component> local_cf8;
  shared_ptr<libcellml::Variable> local_ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8;
  undefined1 local_cb8 [8];
  AssertionResult gtest_ar_24;
  Message local_ca0 [15];
  allocator<char> local_c91;
  string local_c90 [32];
  shared_ptr<libcellml::Component> local_c70;
  shared_ptr<libcellml::Component> local_c60;
  shared_ptr<libcellml::Variable> local_c50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c40;
  undefined1 local_c20 [8];
  AssertionResult gtest_ar_23;
  Message local_c08 [15];
  allocator<char> local_bf9;
  string local_bf8 [32];
  shared_ptr<libcellml::Component> local_bd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc8;
  undefined1 local_ba8 [8];
  AssertionResult gtest_ar_22;
  Message local_b90 [15];
  allocator<char> local_b81;
  string local_b80 [32];
  shared_ptr<libcellml::Component> local_b60;
  shared_ptr<libcellml::Component> local_b50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b40;
  undefined1 local_b20 [8];
  AssertionResult gtest_ar_21;
  Message local_b08 [15];
  allocator<char> local_af9;
  string local_af8 [32];
  shared_ptr<libcellml::Component> local_ad8;
  shared_ptr<libcellml::Reset> local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  undefined1 local_a98 [8];
  AssertionResult gtest_ar_20;
  Message local_a80 [15];
  allocator<char> local_a71;
  string local_a70 [32];
  shared_ptr<libcellml::Component> local_a50;
  shared_ptr<libcellml::Reset> local_a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  undefined1 local_a10 [8];
  AssertionResult gtest_ar_19;
  Message local_9f8 [15];
  allocator<char> local_9e9;
  string local_9e8 [32];
  shared_ptr<libcellml::Component> local_9c8;
  shared_ptr<libcellml::Reset> local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  undefined1 local_988 [8];
  AssertionResult gtest_ar_18;
  Message local_970 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  undefined1 local_948 [8];
  AssertionResult gtest_ar_17;
  Message local_930 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  undefined1 local_908 [8];
  AssertionResult gtest_ar_16;
  Message local_8f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  undefined1 local_8c8 [8];
  AssertionResult gtest_ar_15;
  Message local_8b0 [15];
  allocator<char> local_8a1;
  string local_8a0 [32];
  shared_ptr<libcellml::Component> local_880;
  shared_ptr<libcellml::Variable> local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  undefined1 local_840 [8];
  AssertionResult gtest_ar_14;
  Message local_828 [15];
  allocator<char> local_819;
  string local_818 [32];
  shared_ptr<libcellml::Component> local_7f8;
  shared_ptr<libcellml::Variable> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar_13;
  Message local_7a0 [15];
  allocator<char> local_791;
  string local_790 [32];
  shared_ptr<libcellml::Component> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  undefined1 local_740 [8];
  AssertionResult gtest_ar_12;
  Message local_728 [15];
  allocator<char> local_719;
  string local_718 [32];
  shared_ptr<libcellml::Component> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  undefined1 local_6c8 [8];
  AssertionResult gtest_ar_11;
  Message local_6b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  undefined1 local_688 [8];
  AssertionResult gtest_ar_10;
  Message local_670 [8];
  shared_ptr<libcellml::Units> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  undefined1 local_638 [8];
  AssertionResult gtest_ar_9;
  Message local_620 [8];
  shared_ptr<libcellml::Units> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  undefined1 local_5e8 [8];
  AssertionResult gtest_ar_8;
  Message local_5d0 [8];
  shared_ptr<libcellml::Units> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  undefined1 local_598 [8];
  AssertionResult gtest_ar_7;
  Message local_580 [8];
  shared_ptr<libcellml::Units> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  undefined1 local_548 [8];
  AssertionResult gtest_ar_6;
  Message local_530 [8];
  shared_ptr<libcellml::Units> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_5;
  Message local_4e0 [15];
  allocator<char> local_4d1;
  string local_4d0 [32];
  shared_ptr<libcellml::Units> local_4b0;
  shared_ptr<libcellml::ImportSource> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_4;
  Message local_458 [15];
  allocator<char> local_449;
  string local_448 [32];
  shared_ptr<libcellml::Component> local_428;
  shared_ptr<libcellml::ImportSource> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_3;
  Message local_3d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_378 [8];
  Message local_370 [15];
  bool local_361;
  undefined1 local_360 [8];
  AssertionResult gtest_ar__1;
  Message local_348 [8];
  shared_ptr<libcellml::Issue> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_1;
  Message local_2f8 [8];
  unsigned_long local_2f0 [2];
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_2b0 [8];
  Message local_2a8 [15];
  bool local_299;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [32];
  shared_ptr<libcellml::Component> local_238;
  undefined1 local_228 [8];
  VariablePtr c4v1;
  string local_210 [39];
  allocator<char> local_1e9;
  string local_1e8 [32];
  shared_ptr<libcellml::Component> local_1c8;
  undefined1 local_1b8 [8];
  VariablePtr c3v2;
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [32];
  shared_ptr<libcellml::Component> local_158;
  undefined1 local_148 [8];
  VariablePtr c3v1;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [32];
  shared_ptr<libcellml::Component> local_e8;
  undefined1 local_d8 [8];
  VariablePtr c2v2;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [32];
  shared_ptr<libcellml::Component> local_78;
  undefined1 local_68 [8];
  VariablePtr c2v1;
  undefined1 local_48 [8];
  ModelPtr model;
  ParserPtr parser;
  AnnotatorPtr annotator;
  char *expectedError;
  Annotator_automaticIdsOnEverything_Test *this_local;
  
  annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_13107;
  libcellml::Annotator::create();
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  libcellml::Parser::parseModel((string *)local_48);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"component2",&local_99);
  libcellml::ComponentEntity::component((string *)&local_78,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"variable1",
             (allocator<char> *)
             ((long)&c2v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)local_68);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c2v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"component2",&local_109);
  libcellml::ComponentEntity::component((string *)&local_e8,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"variable2",
             (allocator<char> *)
             ((long)&c3v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)local_d8);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c3v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"component3",&local_179);
  libcellml::ComponentEntity::component((string *)&local_158,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a0,"variable1",
             (allocator<char> *)
             ((long)&c3v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)local_148);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c3v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"component3",&local_1e9);
  libcellml::ComponentEntity::component((string *)&local_1c8,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_210,"variable2",
             (allocator<char> *)
             ((long)&c4v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)local_1b8);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c4v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1c8);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258,"component4",&local_259);
  libcellml::ComponentEntity::component((string *)&local_238,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_238);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_280,"variable1",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Component::variable((string *)local_228);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_238);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  bVar1 = libcellml::Annotator::assignAllIds();
  local_299 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_298,&local_299,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar2) {
    testing::Message::Message(local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_298,"annotator->assignAllIds()","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x1ed,pcVar4);
    testing::internal::AssertHelper::operator=(local_2b0,local_2a8);
    testing::internal::AssertHelper::~AssertHelper(local_2b0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  local_2f0[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_2f0[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_2e0,"size_t(1)","annotator->errorCount()",local_2f0 + 1,
             local_2f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar2) {
    testing::Message::Message(local_2f8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x1ee,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::error((ulong)&local_340);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_340);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_310,"expectedError","annotator->error(0)->description()",
             (char **)&annotator.
                       super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_340);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar2) {
    testing::Message::Message(local_348);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x1ef,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  peVar5 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  libcellml::Annotator::setModel((shared_ptr *)peVar5);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  bVar1 = libcellml::Annotator::assignAllIds();
  local_361 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_360,&local_361,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar2) {
    testing::Message::Message(local_370);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_2.message_,local_360,"annotator->assignAllIds()","false"
              );
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x1f2,pcVar4);
    testing::internal::AssertHelper::operator=(local_378,local_370);
    testing::internal::AssertHelper::~AssertHelper(local_378);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_48);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_3a8,"\"b4da55\"","model->id()",(char (*) [7])"b4da55",
             &local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar2) {
    testing::Message::Message(local_3d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,500,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_3d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_448,"component1",&local_449);
  libcellml::ComponentEntity::component((string *)&local_428,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_428);
  libcellml::ImportedEntity::importSource();
  std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&local_418);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_3e8,"\"b4da56\"",
             "model->component(\"component1\")->importSource()->id()",(char (*) [7])"b4da56",
             &local_408);
  std::__cxx11::string::~string((string *)&local_408);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_418);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_428);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator(&local_449);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar2) {
    testing::Message::Message(local_458);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x1f5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_458);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4d0,"units1",&local_4d1);
  libcellml::Model::units((string *)&local_4b0);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_4b0);
  libcellml::ImportedEntity::importSource();
  std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&local_4a0);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_470,"\"b4da57\"",
             "model->units(\"units1\")->importSource()->id()",(char (*) [7])"b4da57",&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_4a0);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_4b0);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar2) {
    testing::Message::Message(local_4e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x1f6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_4e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_48);
  libcellml::Model::units((ulong)&local_528);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_528);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_4f8,"\"b4da58\"","model->units(0)->id()",
             (char (*) [7])"b4da58",&local_518);
  std::__cxx11::string::~string((string *)&local_518);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_528);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar2) {
    testing::Message::Message(local_530);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x1f7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_530);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_48);
  libcellml::Model::units((ulong)&local_578);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_578);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_548,"\"b4da59\"","model->units(1)->id()",
             (char (*) [7])"b4da59",&local_568);
  std::__cxx11::string::~string((string *)&local_568);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_578);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar2) {
    testing::Message::Message(local_580);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x1f8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_580);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_48);
  libcellml::Model::units((ulong)&local_5c8);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_5c8);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_598,"\"b4da5a\"","model->units(2)->id()",
             (char (*) [7])"b4da5a",&local_5b8);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_5c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_598);
  if (!bVar2) {
    testing::Message::Message(local_5d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_598);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x1f9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_5d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_5d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_598);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_48);
  libcellml::Model::units((ulong)&local_618);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_618);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_5e8,"\"b4da5b\"","model->units(3)->id()",
             (char (*) [7])"b4da5b",&local_608);
  std::__cxx11::string::~string((string *)&local_608);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_618);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e8);
  if (!bVar2) {
    testing::Message::Message(local_620);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x1fa,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_620);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(local_620);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_48);
  libcellml::Model::units((ulong)&local_668);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_668);
  libcellml::Units::unitId_abi_cxx11_((ulong)&local_658);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_638,"\"b4da5c\"","model->units(1)->unitId(0)",
             (char (*) [7])"b4da5c",&local_658);
  std::__cxx11::string::~string((string *)&local_658);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_668);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
  if (!bVar2) {
    testing::Message::Message(local_670);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_638);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x1fb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,local_670);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_6a8,(shared_ptr *)local_68);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_688,"\"b4da61\"",
             "libcellml::Variable::equivalenceConnectionId(c2v1, c4v1)",(char (*) [7])"b4da61",
             &local_6a8);
  std::__cxx11::string::~string((string *)&local_6a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar2) {
    testing::Message::Message(local_6b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_688);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x1fd,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,local_6b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(local_6b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_718,"component2",&local_719);
  libcellml::ComponentEntity::component((string *)&local_6f8,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_6f8);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_6c8,"\"b4da64\"","model->component(\"component2\")->id()",
             (char (*) [7])"b4da64",&local_6e8);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_6f8);
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator(&local_719);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c8);
  if (!bVar2) {
    testing::Message::Message(local_728);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x1fe,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,local_728);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c8);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_790,"component2",&local_791);
  libcellml::ComponentEntity::component((string *)&local_770,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_770);
  libcellml::ComponentEntity::encapsulationId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_740,"\"b4da65\"",
             "model->component(\"component2\")->encapsulationId()",(char (*) [7])"b4da65",&local_760
            );
  std::__cxx11::string::~string((string *)&local_760);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_770);
  std::__cxx11::string::~string(local_790);
  std::allocator<char>::~allocator(&local_791);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_740);
  if (!bVar2) {
    testing::Message::Message(local_7a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_740);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x1ff,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,local_7a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(local_7a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_818,"component2",&local_819);
  libcellml::ComponentEntity::component((string *)&local_7f8,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_7f8);
  libcellml::Component::variable((ulong)&local_7e8);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_7e8);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_7b8,"\"b4da66\"",
             "model->component(\"component2\")->variable(0)->id()",(char (*) [7])"b4da66",&local_7d8
            );
  std::__cxx11::string::~string((string *)&local_7d8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_7e8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_7f8);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator(&local_819);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b8);
  if (!bVar2) {
    testing::Message::Message(local_828);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_7b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x200,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,local_828);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(local_828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b8);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8a0,"component2",&local_8a1);
  libcellml::ComponentEntity::component((string *)&local_880,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_880);
  libcellml::Component::variable((ulong)&local_870);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_870);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_840,"\"b4da67\"",
             "model->component(\"component2\")->variable(1)->id()",(char (*) [7])"b4da67",&local_860
            );
  std::__cxx11::string::~string((string *)&local_860);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_870);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_880);
  std::__cxx11::string::~string(local_8a0);
  std::allocator<char>::~allocator(&local_8a1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
  if (!bVar2) {
    testing::Message::Message(local_8b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_840);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x201,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,local_8b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(local_8b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_8e8,(shared_ptr *)local_68);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_8c8,"\"b4da68\"",
             "libcellml::Variable::equivalenceConnectionId(c2v1, c3v1)",(char (*) [7])"b4da68",
             &local_8e8);
  std::__cxx11::string::~string((string *)&local_8e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c8);
  if (!bVar2) {
    testing::Message::Message(local_8f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_8c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x202,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,local_8f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(local_8f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c8);
  libcellml::Variable::equivalenceMappingId_abi_cxx11_
            ((shared_ptr *)&local_928,(shared_ptr *)local_68);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_908,"\"b4da69\"",
             "libcellml::Variable::equivalenceMappingId(c2v1, c3v1)",(char (*) [7])"b4da69",
             &local_928);
  std::__cxx11::string::~string((string *)&local_928);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_908);
  if (!bVar2) {
    testing::Message::Message(local_930);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_908);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x203,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,local_930);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(local_930);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_908);
  libcellml::Variable::equivalenceMappingId_abi_cxx11_
            ((shared_ptr *)&local_968,(shared_ptr *)local_d8);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_948,"\"b4da6a\"",
             "libcellml::Variable::equivalenceMappingId(c2v2, c3v2)",(char (*) [7])"b4da6a",
             &local_968);
  std::__cxx11::string::~string((string *)&local_968);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_948);
  if (!bVar2) {
    testing::Message::Message(local_970);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_948);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x204,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,local_970);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(local_970);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_948);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9e8,"component2",&local_9e9);
  libcellml::ComponentEntity::component((string *)&local_9c8,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_9c8);
  libcellml::Component::reset((ulong)&local_9b8);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_9b8);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_988,"\"b4da6b\"",
             "model->component(\"component2\")->reset(0)->id()",(char (*) [7])"b4da6b",&local_9a8);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_9b8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_9c8);
  std::__cxx11::string::~string(local_9e8);
  std::allocator<char>::~allocator(&local_9e9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_988);
  if (!bVar2) {
    testing::Message::Message(local_9f8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_988);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x205,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,local_9f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(local_9f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_988);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a70,"component2",&local_a71);
  libcellml::ComponentEntity::component((string *)&local_a50,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_a50);
  libcellml::Component::reset((ulong)&local_a40);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_a40);
  libcellml::Reset::resetValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_a10,"\"b4da6c\"",
             "model->component(\"component2\")->reset(0)->resetValueId()",(char (*) [7])"b4da6c",
             &local_a30);
  std::__cxx11::string::~string((string *)&local_a30);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_a40);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_a50);
  std::__cxx11::string::~string(local_a70);
  std::allocator<char>::~allocator(&local_a71);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a10);
  if (!bVar2) {
    testing::Message::Message(local_a80);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x206,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,local_a80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(local_a80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a10);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_af8,"component2",&local_af9);
  libcellml::ComponentEntity::component((string *)&local_ad8,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_ad8);
  libcellml::Component::reset((ulong)&local_ac8);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_ac8);
  libcellml::Reset::testValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_a98,"\"b4da6d\"",
             "model->component(\"component2\")->reset(0)->testValueId()",(char (*) [7])"b4da6d",
             &local_ab8);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_ac8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_ad8);
  std::__cxx11::string::~string(local_af8);
  std::allocator<char>::~allocator(&local_af9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a98);
  if (!bVar2) {
    testing::Message::Message(local_b08);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x207,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,local_b08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(local_b08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a98);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b80,"component2",&local_b81);
  libcellml::ComponentEntity::component((string *)&local_b60,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_b60);
  libcellml::ComponentEntity::component((ulong)&local_b50);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_b50);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_b20,"\"b4da6e\"",
             "model->component(\"component2\")->component(0)->id()",(char (*) [7])"b4da6e",
             &local_b40);
  std::__cxx11::string::~string((string *)&local_b40);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_b50);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_b60);
  std::__cxx11::string::~string(local_b80);
  std::allocator<char>::~allocator(&local_b81);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b20);
  if (!bVar2) {
    testing::Message::Message(local_b90);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x208,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,local_b90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(local_b90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b20);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_bf8,"component3",&local_bf9);
  libcellml::ComponentEntity::component((string *)&local_bd8,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_bd8);
  libcellml::ComponentEntity::encapsulationId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_ba8,"\"b4da6f\"",
             "model->component(\"component3\")->encapsulationId()",(char (*) [7])"b4da6f",&local_bc8
            );
  std::__cxx11::string::~string((string *)&local_bc8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_bd8);
  std::__cxx11::string::~string(local_bf8);
  std::allocator<char>::~allocator(&local_bf9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba8);
  if (!bVar2) {
    testing::Message::Message(local_c08);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_ba8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x209,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,local_c08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(local_c08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba8);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c90,"component2",&local_c91);
  libcellml::ComponentEntity::component((string *)&local_c70,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_c70);
  libcellml::ComponentEntity::component((ulong)&local_c60);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_c60);
  libcellml::Component::variable((ulong)&local_c50);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_c50);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_c20,"\"b4da70\"",
             "model->component(\"component2\")->component(0)->variable(0)->id()",
             (char (*) [7])"b4da70",&local_c40);
  std::__cxx11::string::~string((string *)&local_c40);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_c50);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_c60);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_c70);
  std::__cxx11::string::~string(local_c90);
  std::allocator<char>::~allocator(&local_c91);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c20);
  if (!bVar2) {
    testing::Message::Message(local_ca0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x20a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,local_ca0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(local_ca0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c20);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d28,"component2",&local_d29);
  libcellml::ComponentEntity::component((string *)&local_d08,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_d08);
  libcellml::ComponentEntity::component((ulong)&local_cf8);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_cf8);
  libcellml::Component::variable((ulong)&local_ce8);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_ce8);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_cb8,"\"b4da71\"",
             "model->component(\"component2\")->component(0)->variable(1)->id()",
             (char (*) [7])"b4da71",&local_cd8);
  std::__cxx11::string::~string((string *)&local_cd8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_ce8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_cf8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_d08);
  std::__cxx11::string::~string(local_d28);
  std::allocator<char>::~allocator(&local_d29);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb8);
  if (!bVar2) {
    testing::Message::Message(local_d38);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_cb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x20b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,local_d38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(local_d38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cb8);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_48);
  libcellml::ComponentEntity::encapsulationId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_d50,"\"b4da72\"","model->encapsulationId()",
             (char (*) [7])"b4da72",&local_d70);
  std::__cxx11::string::~string((string *)&local_d70);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d50);
  if (!bVar2) {
    testing::Message::Message(local_d78);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d50);
    testing::internal::AssertHelper::AssertHelper
              (local_d80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x20c,pcVar4);
    testing::internal::AssertHelper::operator=(local_d80,local_d78);
    testing::internal::AssertHelper::~AssertHelper(local_d80);
    testing::Message::~Message(local_d78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d50);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_228);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_1b8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_148);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_d8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_68);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_48);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Annotator>::~shared_ptr
            ((shared_ptr<libcellml::Annotator> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Annotator, automaticIdsOnEverything)
{
    auto expectedError = "This Annotator object does not have a model to work with.";
    auto annotator = libcellml::Annotator::create();
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringNoIds);

    auto c2v1 = model->component("component2")->variable("variable1");
    auto c2v2 = model->component("component2")->variable("variable2");
    auto c3v1 = model->component("component3")->variable("variable1");
    auto c3v2 = model->component("component3")->variable("variable2");
    auto c4v1 = model->component("component4")->variable("variable1");

    EXPECT_FALSE(annotator->assignAllIds());
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ(expectedError, annotator->error(0)->description());

    annotator->setModel(model);
    EXPECT_TRUE(annotator->assignAllIds());

    EXPECT_EQ("b4da55", model->id());
    EXPECT_EQ("b4da56", model->component("component1")->importSource()->id());
    EXPECT_EQ("b4da57", model->units("units1")->importSource()->id());
    EXPECT_EQ("b4da58", model->units(0)->id());
    EXPECT_EQ("b4da59", model->units(1)->id());
    EXPECT_EQ("b4da5a", model->units(2)->id());
    EXPECT_EQ("b4da5b", model->units(3)->id());
    EXPECT_EQ("b4da5c", model->units(1)->unitId(0));

    EXPECT_EQ("b4da61", libcellml::Variable::equivalenceConnectionId(c2v1, c4v1));
    EXPECT_EQ("b4da64", model->component("component2")->id());
    EXPECT_EQ("b4da65", model->component("component2")->encapsulationId());
    EXPECT_EQ("b4da66", model->component("component2")->variable(0)->id());
    EXPECT_EQ("b4da67", model->component("component2")->variable(1)->id());
    EXPECT_EQ("b4da68", libcellml::Variable::equivalenceConnectionId(c2v1, c3v1));
    EXPECT_EQ("b4da69", libcellml::Variable::equivalenceMappingId(c2v1, c3v1));
    EXPECT_EQ("b4da6a", libcellml::Variable::equivalenceMappingId(c2v2, c3v2));
    EXPECT_EQ("b4da6b", model->component("component2")->reset(0)->id());
    EXPECT_EQ("b4da6c", model->component("component2")->reset(0)->resetValueId());
    EXPECT_EQ("b4da6d", model->component("component2")->reset(0)->testValueId());
    EXPECT_EQ("b4da6e", model->component("component2")->component(0)->id());
    EXPECT_EQ("b4da6f", model->component("component3")->encapsulationId());
    EXPECT_EQ("b4da70", model->component("component2")->component(0)->variable(0)->id());
    EXPECT_EQ("b4da71", model->component("component2")->component(0)->variable(1)->id());
    EXPECT_EQ("b4da72", model->encapsulationId());
}